

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,TypeCast *c)

{
  pool_ref<soul::AST::Expression> *e;
  size_t *psVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  CommaSeparatedList *list;
  Expression *pEVar5;
  Constant *pCVar6;
  Value castValue;
  pool_ptr<soul::AST::Constant> cv;
  Type local_d0;
  Value local_b8;
  long local_78;
  Value local_70;
  
  e = &c->source;
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
  iVar3 = (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(c);
  if ((char)iVar3 == '\0') {
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
  }
  else {
    pEVar5 = e->object;
    if (pEVar5 != (Expression *)0x0) {
      lVar4 = __dynamic_cast(pEVar5,&AST::Expression::typeinfo,&AST::CommaSeparatedList::typeinfo,0)
      ;
      if ((lVar4 != 0) && (*(long *)(lVar4 + 0x38) == 0)) {
        local_d0.category = (c->targetType).category;
        local_d0.arrayElementCategory = (c->targetType).arrayElementCategory;
        local_d0.isRef = (c->targetType).isRef;
        local_d0.isConstant = (c->targetType).isConstant;
        local_d0.primitiveType.type = (c->targetType).primitiveType.type;
        local_d0.boundingSize = (c->targetType).boundingSize;
        local_d0.arrayElementBoundingSize = (c->targetType).arrayElementBoundingSize;
        local_d0.structure.object = (c->targetType).structure.object;
        if (local_d0.structure.object != (Structure *)0x0) {
          ((local_d0.structure.object)->super_RefCountedObject).refCount =
               ((local_d0.structure.object)->super_RefCountedObject).refCount + 1;
        }
        soul::Value::zeroInitialiser(&local_70,&local_d0);
        pCVar6 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context_const&,soul::Value>
                           (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                            &(c->super_Expression).super_Statement.super_ASTObject.context,&local_70
                           );
        soul::Value::~Value(&local_70);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_d0.structure.object);
        return &pCVar6->super_Expression;
      }
      list = (CommaSeparatedList *)
             __dynamic_cast(pEVar5,&AST::Expression::typeinfo,&AST::CommaSeparatedList::typeinfo,0);
      if (list != (CommaSeparatedList *)0x0) {
        pEVar5 = convertExpressionListToConstant(this,&c->super_Expression,&c->targetType,list);
        return pEVar5;
      }
    }
    if (*(ExpressionKind *)&((Statement *)&pEVar5->kind)->super_ASTObject == value) {
      iVar3 = (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar5);
      pEVar5 = e->object;
      if ((char)iVar3 != '\0') {
        (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_b8,pEVar5);
        bVar2 = Type::isEqual(&local_b8.type,&c->targetType,0);
        RefCountedPtr<soul::Structure>::decIfNotNull(local_b8.type.structure.object);
        pEVar5 = e->object;
        if (bVar2) {
          return pEVar5;
        }
      }
    }
    (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_78,pEVar5);
    if (local_78 != 0) {
      soul::Value::tryCastToType(&local_b8,(Value *)(local_78 + 0x30),&c->targetType);
      if (local_b8.type.category == invalid) {
        soul::Value::~Value(&local_b8);
      }
      else {
        c = (TypeCast *)
            PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value&>
                      (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                       &(c->super_Expression).super_Statement.super_ASTObject.context,&local_b8);
        soul::Value::~Value(&local_b8);
      }
    }
  }
  return &((Constant *)c)->super_Expression;
}

Assistant:

AST::Expression& visit (AST::TypeCast& c) override
        {
            super::visit (c);

            if (failIfNotResolved (c))
                return c;

            if (c.getNumArguments() == 0)
                return createConstant (c.context, Value::zeroInitialiser (c.targetType));

            if (auto list = cast<AST::CommaSeparatedList> (c.source))
                return convertExpressionListToConstant (c, c.targetType, *list);

            if (AST::isResolvedAsValue (c.source.get()) && c.source->getResultType().isIdentical (c.targetType))
                return c.source;

            if (auto cv = c.source->getAsConstant())
            {
                auto castValue = cv->value.tryCastToType (c.targetType);

                if (castValue.isValid())
                    return allocator.allocate<AST::Constant> (c.context, castValue);
            }

            return c;
        }